

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O0

int INT_EVdfg_set_attr_list(EVdfg_stone stone,attr_list attrs)

{
  int iVar1;
  undefined8 in_RSI;
  EVdfg_config_action act;
  int in_stack_000000f4;
  EVdfg_configuration in_stack_000000f8;
  undefined1 in_stack_00000110 [32];
  
  add_ref_attr_list(in_RSI);
  iVar1 = EVdfg_perform_act_on_state
                    (in_stack_000000f8,(EVdfg_config_action)in_stack_00000110,in_stack_000000f4);
  return iVar1;
}

Assistant:

extern int
INT_EVdfg_set_attr_list(EVdfg_stone stone, attr_list attrs)
{
    EVdfg_config_action act;
    act.type = ACT_set_attrs;
    act.stone_id = stone->stone_id;
    act.u.attrs.attrs = attrs;
    add_ref_attr_list(attrs);
    return EVdfg_perform_act_on_state(stone->dfg->working_state, act, 1 /* add to queue */);
}